

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRefSelect.c
# Opt level: O1

void Ga2_StructAnalize(Gia_Man_t *p,Vec_Int_t *vFront,Vec_Int_t *vInter,Vec_Int_t *vNewPPis)

{
  ulong *puVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  char *__format;
  long lVar8;
  
  if (0 < p->nObjs) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = (ulong *)(&p->pObjs->field_0x0 + lVar8);
      *puVar1 = *puVar1 & 0xbfffffffbfffffff;
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0xc;
    } while (lVar7 < p->nObjs);
  }
  if (0 < vFront->nSize) {
    lVar7 = 0;
    do {
      lVar8 = (long)vFront->pArray[lVar7];
      if ((lVar8 < 0) || (p->nObjs <= vFront->pArray[lVar7])) goto LAB_00574749;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      *(ulong *)(pGVar3 + lVar8) = *(ulong *)(pGVar3 + lVar8) & 0xbfffffffbfffffff | 0x40000000;
      lVar7 = lVar7 + 1;
    } while (lVar7 < vFront->nSize);
  }
  if (0 < vInter->nSize) {
    lVar7 = 0;
    do {
      iVar2 = vInter->pArray[lVar7];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00574749;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar2;
      *(ulong *)pGVar3 = *(ulong *)pGVar3 | 0x4000000000000000;
      lVar7 = lVar7 + 1;
    } while (lVar7 < vInter->nSize);
  }
  if (0 < vNewPPis->nSize) {
    lVar7 = 0;
    do {
      iVar2 = vNewPPis->pArray[lVar7];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00574749;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar2;
      *(ulong *)pGVar3 = *(ulong *)pGVar3 | 0x4000000000000000;
      lVar7 = lVar7 + 1;
    } while (lVar7 < vNewPPis->nSize);
  }
  if (0 < vNewPPis->nSize) {
    uVar6 = 0;
LAB_0057459d:
    iVar2 = vNewPPis->pArray[uVar6];
    if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_00574749:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (p->pObjs != (Gia_Obj_t *)0x0) {
      pGVar3 = p->pObjs + iVar2;
      uVar6 = uVar6 + 1;
      printf("Selected PPI %3d : ",uVar6 & 0xffffffff);
      pGVar4 = p->pObjs;
      if ((pGVar3 < pGVar4) || (pGVar4 + p->nObjs <= pGVar3)) {
LAB_00574768:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      printf("%6d ",(ulong)(uint)((int)((ulong)((long)pGVar3 - (long)pGVar4) >> 2) * -0x55555555));
      putchar(10);
      Ga2_ObjLeaves(p,pGVar3);
      if (0 < Ga2_ObjLeaves_v_0) {
        lVar7 = 0;
        do {
          iVar2 = *(int *)(Ga2_ObjLeaves_v_1 + lVar7 * 4);
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00574749;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar2;
          printf("    ");
          pGVar4 = p->pObjs;
          if ((pGVar3 < pGVar4) || (pGVar4 + p->nObjs <= pGVar3)) goto LAB_00574768;
          printf("%6d ",(ulong)(uint)((int)((ulong)((long)pGVar3 - (long)pGVar4) >> 2) * -0x55555555
                                     ));
          uVar5 = *(ulong *)pGVar3;
          __format = "selected PPI";
          if ((~uVar5 & 0x4000000040000000) == 0) {
LAB_00574704:
            printf(__format);
          }
          else {
            __format = "frontier (original PI or PPI)";
            if ((((uVar5 & 0x4000000040000000) == 0x40000000) ||
                (__format = "abstracted node", (uVar5 & 0x4000000040000000) == 0x4000000000000000))
               || (__format = "free variable", (uVar5 & 0x4000000040000000) == 0))
            goto LAB_00574704;
          }
          putchar(10);
          lVar7 = lVar7 + 1;
        } while (lVar7 < Ga2_ObjLeaves_v_0);
      }
      if ((long)uVar6 < (long)vNewPPis->nSize) goto LAB_0057459d;
    }
  }
  return;
}

Assistant:

void Ga2_StructAnalize( Gia_Man_t * p, Vec_Int_t * vFront, Vec_Int_t * vInter, Vec_Int_t * vNewPPis )
{
    Vec_Int_t * vFanins;
    Gia_Obj_t * pObj, * pFanin;
    int i, k;
    // clean labels
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = pObj->fMark1 = 0;
    // label frontier
    Gia_ManForEachObjVec( vFront, p, pObj, i )
        pObj->fMark0 = 1, pObj->fMark1 = 0;
    // label objects
    Gia_ManForEachObjVec( vInter, p, pObj, i )
        pObj->fMark1 = 0, pObj->fMark1 = 1;
    // label selected
    Gia_ManForEachObjVec( vNewPPis, p, pObj, i )
        pObj->fMark1 = 1, pObj->fMark1 = 1;
    // explore selected
    Gia_ManForEachObjVec( vNewPPis, p, pObj, i )
    {
        printf( "Selected PPI %3d : ", i+1 );
        printf( "%6d ",  Gia_ObjId(p, pObj) );
        printf( "\n" );
        vFanins = Ga2_ObjLeaves( p, pObj );
        Gia_ManForEachObjVec( vFanins, p, pFanin, k )
        {
            printf( "    " );
            printf( "%6d ", Gia_ObjId(p, pFanin) );
            if ( pFanin->fMark0 && pFanin->fMark1 )
                printf( "selected PPI" );
            else if ( pFanin->fMark0 && !pFanin->fMark1 )
                printf( "frontier (original PI or PPI)" );
            else if ( !pFanin->fMark0 &&  pFanin->fMark1 )
                printf( "abstracted node" );
            else if ( !pFanin->fMark0 && !pFanin->fMark1 )
                printf( "free variable" );
            printf( "\n" );
        }
    }
}